

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t readSkippableFrameSize(void *src,size_t srcSize)

{
  U32 UVar1;
  size_t skippableSize;
  U32 sizeU32;
  size_t skippableHeaderSize;
  size_t srcSize_local;
  void *src_local;
  
  if (srcSize < 8) {
    src_local = (void *)0xffffffffffffffb8;
  }
  else {
    UVar1 = MEM_readLE32((void *)((long)src + 4));
    if (UVar1 + 8 < UVar1) {
      src_local = (void *)0xfffffffffffffff2;
    }
    else {
      src_local = (void *)((ulong)UVar1 + 8);
      if (srcSize < src_local) {
        src_local = (void *)0xffffffffffffffb8;
      }
    }
  }
  return (size_t)src_local;
}

Assistant:

static size_t readSkippableFrameSize(void const* src, size_t srcSize)
{
    size_t const skippableHeaderSize = ZSTD_SKIPPABLEHEADERSIZE;
    U32 sizeU32;

    RETURN_ERROR_IF(srcSize < ZSTD_SKIPPABLEHEADERSIZE, srcSize_wrong, "");

    sizeU32 = MEM_readLE32((BYTE const*)src + ZSTD_FRAMEIDSIZE);
    RETURN_ERROR_IF((U32)(sizeU32 + ZSTD_SKIPPABLEHEADERSIZE) < sizeU32,
                    frameParameter_unsupported, "");
    {
        size_t const skippableSize = skippableHeaderSize + sizeU32;
        RETURN_ERROR_IF(skippableSize > srcSize, srcSize_wrong, "");
        return skippableSize;
    }
}